

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O0

size_type __thiscall
re2c::free_list<re2c::Range_*>::erase(free_list<re2c::Range_*> *this,key_type *key)

{
  key_type *key_local;
  free_list<re2c::Range_*> *this_local;
  
  if ((this->in_clear & 1U) == 0) {
    this_local = (free_list<re2c::Range_*> *)
                 std::set<re2c::Range_*,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>::
                 erase(&this->
                        super_set<re2c::Range_*,_std::less<re2c::Range_*>,_std::allocator<re2c::Range_*>_>
                       ,key);
  }
  else {
    this_local = (free_list<re2c::Range_*> *)0x0;
  }
  return (size_type)this_local;
}

Assistant:

size_type erase(const key_type& key)
	{
		if (!in_clear)
		{
			return std::set<_Ty>::erase(key);
		}
		return 0;
	}